

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int c1fgkb_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int *in_RCX;
  long lVar23;
  int iVar24;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  long in_R9;
  int cc_offset;
  int cc_dim3;
  int cc_dim2;
  int cc_dim1;
  int ch_offset;
  int ch_dim3;
  int ch_dim2;
  int ch_dim1;
  int local_a4;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  double chold2;
  double chold1;
  int ipph;
  int idlj;
  int ipp2;
  double war;
  double wai;
  int ki;
  int lc;
  int jc;
  int l;
  int k;
  int j;
  int i__;
  int i__3;
  int i__2;
  int i__1;
  int wa_offset;
  int wa_dim2;
  int wa_dim1;
  int ch1_offset;
  int ch1_dim2;
  int ch1_dim1;
  int cc1_offset;
  int cc1_dim2;
  int cc1_dim1;
  
  iVar3 = *in_RDI;
  iVar13 = *in_RSI + -1;
  iVar14 = iVar3 * *in_RSI + 1;
  iVar4 = *_ch_offset;
  iVar5 = *in_RCX;
  lVar20 = _cc_dim2 + (long)(iVar4 * (iVar5 + 1) + 1) * -8;
  iVar19 = *_ch_offset;
  iVar6 = *in_RDX;
  iVar7 = *in_RSI;
  lVar21 = in_R9 + (long)(iVar19 * (iVar6 * (iVar7 + 1) + 1) + 1) * -8;
  iVar8 = *na;
  iVar9 = *in_RCX;
  iVar15 = iVar8 * (iVar9 + 1) + 1;
  iVar10 = *na;
  iVar11 = *in_RDX;
  iVar12 = *in_RDI;
  lVar22 = _ch_dim2 + (long)(iVar10 * (iVar11 * (iVar12 + 1) + 1) + 1) * -8;
  iVar16 = *in_RSI + 2;
  iVar17 = (*in_RSI + 1) / 2;
  iVar24 = *in_RCX;
  for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
    cc[(long)((local_a4 + iVar9) * iVar8 + 1) - (long)iVar15] =
         *(double *)(lVar20 + (long)((local_a4 + iVar5) * iVar4 + 1) * 8);
    cc[(long)((local_a4 + iVar9) * iVar8 + 2) - (long)iVar15] =
         *(double *)(lVar20 + (long)((local_a4 + iVar5) * iVar4 + 2) * 8);
  }
  for (local_90 = 2; local_90 <= iVar17; local_90 = local_90 + 1) {
    iVar18 = iVar16 - local_90;
    iVar24 = *in_RCX;
    for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
      cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 1) - (long)iVar15] =
           *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8) +
           *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 1) * 8);
      cc[(long)((local_a4 + iVar18 * iVar9) * iVar8 + 1) - (long)iVar15] =
           *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8) -
           *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 1) * 8);
      cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 2) - (long)iVar15] =
           *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 2) * 8) +
           *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 2) * 8);
      cc[(long)((local_a4 + iVar18 * iVar9) * iVar8 + 2) - (long)iVar15] =
           *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 2) * 8) -
           *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 2) * 8);
    }
  }
  for (local_90 = 2; local_90 <= iVar17; local_90 = local_90 + 1) {
    iVar24 = *in_RCX;
    for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
      lVar23 = (long)((local_a4 + iVar5) * iVar4 + 1);
      *(double *)(lVar20 + lVar23 * 8) =
           cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 1) - (long)iVar15] +
           *(double *)(lVar20 + lVar23 * 8);
      lVar23 = (long)((local_a4 + iVar5) * iVar4 + 2);
      *(double *)(lVar20 + lVar23 * 8) =
           cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 2) - (long)iVar15] +
           *(double *)(lVar20 + lVar23 * 8);
    }
  }
  for (local_98 = 2; local_98 <= iVar17; local_98 = local_98 + 1) {
    iVar18 = iVar16 - local_98;
    iVar24 = *in_RCX;
    for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
      *(double *)(lVar20 + (long)((local_a4 + local_98 * iVar5) * iVar4 + 1) * 8) =
           *(double *)(lid + (long)iVar14 * -2 + (long)((local_98 + -1 + iVar13) * iVar3 + 1) * 2) *
           cc[(long)((local_a4 + iVar9 * 2) * iVar8 + 1) - (long)iVar15] +
           cc[(long)((local_a4 + iVar9) * iVar8 + 1) - (long)iVar15];
      *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 1) * 8) =
           *(double *)
            (lid + (long)iVar14 * -2 + (long)((local_98 + -1 + iVar13 * 2) * iVar3 + 1) * 2) *
           cc[(long)((local_a4 + *in_RSI * iVar9) * iVar8 + 1) - (long)iVar15];
      *(double *)(lVar20 + (long)((local_a4 + local_98 * iVar5) * iVar4 + 2) * 8) =
           *(double *)(lid + (long)iVar14 * -2 + (long)((local_98 + -1 + iVar13) * iVar3 + 1) * 2) *
           cc[(long)((local_a4 + iVar9 * 2) * iVar8 + 2) - (long)iVar15] +
           cc[(long)((local_a4 + iVar9) * iVar8 + 2) - (long)iVar15];
      *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 2) * 8) =
           *(double *)
            (lid + (long)iVar14 * -2 + (long)((local_98 + -1 + iVar13 * 2) * iVar3 + 1) * 2) *
           cc[(long)((local_a4 + *in_RSI * iVar9) * iVar8 + 2) - (long)iVar15];
    }
    for (local_90 = 3; local_90 <= iVar17; local_90 = local_90 + 1) {
      iVar24 = ((local_98 + -1) * (local_90 + -1)) % *in_RSI;
      dVar1 = *(double *)(lid + (long)iVar14 * -2 + (long)((iVar24 + iVar13) * iVar3 + 1) * 2);
      dVar2 = *(double *)(lid + (long)iVar14 * -2 + (long)((iVar24 + iVar13 * 2) * iVar3 + 1) * 2);
      iVar24 = *in_RCX;
      for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
        lVar23 = (long)((local_a4 + local_98 * iVar5) * iVar4 + 1);
        *(double *)(lVar20 + lVar23 * 8) =
             dVar1 * cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 1) - (long)iVar15] +
             *(double *)(lVar20 + lVar23 * 8);
        lVar23 = (long)((local_a4 + iVar18 * iVar5) * iVar4 + 1);
        *(double *)(lVar20 + lVar23 * 8) =
             dVar2 * cc[(long)((local_a4 + (iVar16 - local_90) * iVar9) * iVar8 + 1) - (long)iVar15]
             + *(double *)(lVar20 + lVar23 * 8);
        lVar23 = (long)((local_a4 + local_98 * iVar5) * iVar4 + 2);
        *(double *)(lVar20 + lVar23 * 8) =
             dVar1 * cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 2) - (long)iVar15] +
             *(double *)(lVar20 + lVar23 * 8);
        lVar23 = (long)((local_a4 + iVar18 * iVar5) * iVar4 + 2);
        *(double *)(lVar20 + lVar23 * 8) =
             dVar2 * cc[(long)((local_a4 + (iVar16 - local_90) * iVar9) * iVar8 + 2) - (long)iVar15]
             + *(double *)(lVar20 + lVar23 * 8);
      }
    }
  }
  if ((*in_RDI < 2) && (*in_R8 != 1)) {
    for (local_90 = 2; local_90 <= iVar17; local_90 = local_90 + 1) {
      iVar19 = iVar16 - local_90;
      iVar3 = *in_RCX;
      for (local_a4 = 1; local_a4 <= iVar3; local_a4 = local_a4 + 1) {
        dVar1 = *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8);
        dVar2 = *(double *)(lVar20 + (long)((local_a4 + iVar19 * iVar5) * iVar4 + 2) * 8);
        *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8) -
             *(double *)(lVar20 + (long)((local_a4 + iVar19 * iVar5) * iVar4 + 2) * 8);
        *(double *)(lVar20 + (long)((local_a4 + iVar19 * iVar5) * iVar4 + 2) * 8) =
             *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 2) * 8) -
             *(double *)(lVar20 + (long)((local_a4 + iVar19 * iVar5) * iVar4 + 1) * 8);
        lVar21 = (long)((local_a4 + local_90 * iVar5) * iVar4 + 2);
        *(double *)(lVar20 + lVar21 * 8) =
             *(double *)(lVar20 + (long)((local_a4 + iVar19 * iVar5) * iVar4 + 1) * 8) +
             *(double *)(lVar20 + lVar21 * 8);
        *(double *)(lVar20 + (long)((local_a4 + iVar19 * iVar5) * iVar4 + 1) * 8) = dVar1 + dVar2;
      }
    }
  }
  else {
    iVar24 = *in_RCX;
    for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
      cc[(long)((local_a4 + iVar9) * iVar8 + 1) - (long)iVar15] =
           *(double *)(lVar20 + (long)((local_a4 + iVar5) * iVar4 + 1) * 8);
      cc[(long)((local_a4 + iVar9) * iVar8 + 2) - (long)iVar15] =
           *(double *)(lVar20 + (long)((local_a4 + iVar5) * iVar4 + 2) * 8);
    }
    for (local_90 = 2; local_90 <= iVar17; local_90 = local_90 + 1) {
      iVar18 = iVar16 - local_90;
      iVar24 = *in_RCX;
      for (local_a4 = 1; local_a4 <= iVar24; local_a4 = local_a4 + 1) {
        cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 1) - (long)iVar15] =
             *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8) -
             *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 2) * 8);
        cc[(long)((local_a4 + iVar18 * iVar9) * iVar8 + 1) - (long)iVar15] =
             *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 1) * 8) +
             *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 2) * 8);
        cc[(long)((local_a4 + iVar18 * iVar9) * iVar8 + 2) - (long)iVar15] =
             *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 2) * 8) -
             *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 1) * 8);
        cc[(long)((local_a4 + local_90 * iVar9) * iVar8 + 2) - (long)iVar15] =
             *(double *)(lVar20 + (long)((local_a4 + local_90 * iVar5) * iVar4 + 2) * 8) +
             *(double *)(lVar20 + (long)((local_a4 + iVar18 * iVar5) * iVar4 + 1) * 8);
      }
    }
    if (*in_RDI != 1) {
      iVar4 = *in_RDI;
      for (local_8c = 1; local_8c <= iVar4; local_8c = local_8c + 1) {
        iVar5 = *in_RDX;
        for (local_94 = 1; local_94 <= iVar5; local_94 = local_94 + 1) {
          *(undefined8 *)
           (lVar21 + (long)((local_94 + (local_8c * iVar7 + 1) * iVar6) * iVar19 + 1) * 8) =
               *(undefined8 *)
                (lVar22 + (long)((local_94 + (local_8c + iVar12) * iVar11) * iVar10 + 1) * 8);
          *(undefined8 *)
           (lVar21 + (long)((local_94 + (local_8c * iVar7 + 1) * iVar6) * iVar19 + 2) * 8) =
               *(undefined8 *)
                (lVar22 + (long)((local_94 + (local_8c + iVar12) * iVar11) * iVar10 + 2) * 8);
        }
      }
      iVar4 = *in_RSI;
      for (local_90 = 2; local_90 <= iVar4; local_90 = local_90 + 1) {
        iVar5 = *in_RDX;
        for (local_94 = 1; local_94 <= iVar5; local_94 = local_94 + 1) {
          *(undefined8 *)(lVar21 + (long)((local_94 + (local_90 + iVar7) * iVar6) * iVar19 + 1) * 8)
               = *(undefined8 *)
                  (lVar22 + (long)((local_94 + (local_90 * iVar12 + 1) * iVar11) * iVar10 + 1) * 8);
          *(undefined8 *)(lVar21 + (long)((local_94 + (local_90 + iVar7) * iVar6) * iVar19 + 2) * 8)
               = *(undefined8 *)
                  (lVar22 + (long)((local_94 + (local_90 * iVar12 + 1) * iVar11) * iVar10 + 2) * 8);
        }
      }
      iVar4 = *in_RSI;
      for (local_90 = 2; local_90 <= iVar4; local_90 = local_90 + 1) {
        iVar5 = *in_RDI;
        for (local_8c = 2; local_8c <= iVar5; local_8c = local_8c + 1) {
          iVar8 = *in_RDX;
          for (local_94 = 1; local_94 <= iVar8; local_94 = local_94 + 1) {
            *(double *)
             (lVar21 + (long)((local_94 + (local_90 + local_8c * iVar7) * iVar6) * iVar19 + 1) * 8)
                 = *(double *)
                    (lid + (long)iVar14 * -2 +
                           (long)(local_8c + (local_90 + -1 + iVar13) * iVar3) * 2) *
                   *(double *)
                    (lVar22 + (long)((local_94 + (local_8c + local_90 * iVar12) * iVar11) * iVar10 +
                                    1) * 8) +
                   -(*(double *)
                      (lid + (long)iVar14 * -2 +
                             (long)(local_8c + (local_90 + -1 + iVar13 * 2) * iVar3) * 2) *
                    *(double *)
                     (lVar22 + (long)((local_94 + (local_8c + local_90 * iVar12) * iVar11) * iVar10
                                     + 2) * 8));
            *(double *)
             (lVar21 + (long)((local_94 + (local_90 + local_8c * iVar7) * iVar6) * iVar19 + 2) * 8)
                 = *(double *)
                    (lid + (long)iVar14 * -2 +
                           (long)(local_8c + (local_90 + -1 + iVar13) * iVar3) * 2) *
                   *(double *)
                    (lVar22 + (long)((local_94 + (local_8c + local_90 * iVar12) * iVar11) * iVar10 +
                                    2) * 8) +
                   *(double *)
                    (lid + (long)iVar14 * -2 +
                           (long)(local_8c + (local_90 + -1 + iVar13 * 2) * iVar3) * 2) *
                   *(double *)
                    (lVar22 + (long)((local_94 + (local_8c + local_90 * iVar12) * iVar11) * iVar10 +
                                    1) * 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int c1fgkb_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    chold2 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] += cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 1];
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
/* L134: */
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}